

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  long lVar1;
  uint uVar2;
  bool bVar3;
  Descriptor *pDVar4;
  GeneratorOptions *pGVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  long *plVar7;
  undefined8 *puVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  size_type *psVar11;
  string *descriptor;
  Printer *pPVar12;
  FieldDescriptor *pFVar13;
  Printer *pPVar14;
  string *descriptor_00;
  undefined1 *args_1;
  _Base_ptr *pp_Var15;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *field_02;
  FieldDescriptor *desc;
  FieldDescriptor *field_03;
  FieldDescriptor *extraout_RDX;
  char *pcVar16;
  string *psVar17;
  char *pcVar18;
  FieldDescriptor *this_00;
  _Alloc_hider _Var19;
  BytesMode BVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  string value_type;
  undefined1 local_100 [32];
  string key_type;
  undefined1 local_b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Base_ptr local_88;
  undefined1 auStack_80 [8];
  string local_78;
  undefined1 local_58 [8];
  string local_50;
  
  uVar22 = SUB81(&value_type,0);
  descriptor = &value_type;
  descriptor_00 = &value_type;
  psVar17 = &value_type;
  uVar21 = SUB81(&value_type,0);
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    key_type._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    value_type._M_dataplus._M_p = (pointer)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&key_type,
               (FieldDescriptor **)&value_type);
  }
  if ((*(int *)(field + 0x38) == 0xb) &&
     (bVar3 = FieldDescriptor::is_map_message_type(field), bVar3)) {
    pDVar4 = FieldDescriptor::message_type(field);
    pGVar5 = (GeneratorOptions *)Descriptor::FindFieldByNumber(pDVar4,1);
    pDVar4 = FieldDescriptor::message_type(field);
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)Descriptor::FindFieldByNumber(pDVar4,2);
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)options,pGVar5,(FieldDescriptor *)0x0,true,false,
               false,BYTES_DEFAULT,value_type._M_dataplus._M_p._0_1_);
    pFVar13 = (FieldDescriptor *)0x0;
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (&value_type,(_anonymous_namespace_ *)options,(GeneratorOptions *)paVar6,
               (FieldDescriptor *)0x0,true,false,false,BYTES_DEFAULT,
               value_type._M_dataplus._M_p._0_1_);
    (anonymous_namespace)::FieldDefinition_abi_cxx11_
              ((string *)local_100,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               pFVar13);
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
    args_3 = &key_type;
    BVar20 = 0x39cbfa;
    io::Printer::
    Print<char[9],std::__cxx11::string,char[8],std::__cxx11::string,char[10],std::__cxx11::string>
              (printer,
               "/**\n * $fielddef$\n * @param {boolean=} opt_noLazyCreate Do not create the map if\n * empty, instead returning `undefined`\n * @return {!jspb.Map<$keytype$,$valuetype$>}\n */\n"
               ,(char (*) [9])"fielddef",pbVar10,(char (*) [8])"keytype",args_3,
               (char (*) [10])"valuetype",&value_type);
    uVar21 = SUB81(args_3,0);
    if ((Printer *)local_100._0_8_ != (Printer *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_);
    }
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              ((string *)local_100,(_anonymous_namespace_ *)options,
               *(GeneratorOptions **)(field + 0x50),(Descriptor *)pbVar10);
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)&local_98,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar20,(bool)uVar21);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x3d9918);
    paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 == paVar9) {
      local_a8._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_a8._8_8_ = plVar7[3];
      local_b8._0_8_ = &local_a8;
    }
    else {
      local_a8._M_allocated_capacity = paVar9->_M_allocated_capacity;
      local_b8._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar7;
    }
    local_b8._8_8_ = plVar7[1];
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8;
    *plVar7 = (long)paVar9;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    BVar20 = 0x39cc86;
    io::Printer::
    Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[10],std::__cxx11::string>
              (printer,
               "$class$.prototype.$gettername$ = function(opt_noLazyCreate) {\n  return /** @type {!jspb.Map<$keytype$,$valuetype$>} */ (\n"
               ,(char (*) [6])0x3a2f2d,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
               (char (*) [11])"gettername",pbVar10,(char (*) [8])"keytype",&key_type,
               (char (*) [10])"valuetype",&value_type);
    uVar21 = SUB81(pbVar10,0);
    pPVar12 = (Printer *)(local_100 + 0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._0_8_ != &local_a8) {
      operator_delete((void *)local_b8._0_8_);
    }
    if ((_Base_ptr *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity);
    }
    if ((Printer *)local_100._0_8_ != pPVar12) {
      operator_delete((void *)local_100._0_8_);
    }
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,"gettername","gettername",field);
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              ((string *)local_100,(_anonymous_namespace_ *)field,field_02);
    args_1 = local_100;
    io::Printer::Print<char[6],std::__cxx11::string>
              (printer,"      jspb.Message.getMapField(this, $index$, opt_noLazyCreate",
               (char (*) [6])0x3a8ffa,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
    if ((Printer *)local_100._0_8_ != pPVar12) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((once_flag *)
        ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)(paVar6->_M_local_buf + 0x30))->_M_allocated_capacity != (once_flag *)0x0) {
      local_100._0_8_ = FieldDescriptor::TypeOnceInit;
      local_b8._0_8_ = paVar6;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                ((once_flag *)
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(paVar6->_M_local_buf + 0x30))->_M_allocated_capacity,
                 (_func_void_FieldDescriptor_ptr **)local_100,(FieldDescriptor **)local_b8);
    }
    if (*(int *)(paVar6->_M_local_buf + 0x38) == 0xb) {
      pGVar5 = (GeneratorOptions *)
               FieldDescriptor::message_type((FieldDescriptor *)paVar6->_M_local_buf);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                ((string *)local_100,(_anonymous_namespace_ *)options,pGVar5,(Descriptor *)args_1);
      args_1 = local_100;
      io::Printer::Print<char[12],std::__cxx11::string>
                (printer,",\n      $messageType$",(char (*) [12])"messageType",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1);
      if ((Printer *)local_100._0_8_ != pPVar12) {
        operator_delete((void *)local_100._0_8_);
      }
    }
    else {
      io::Printer::Print<>(printer,",\n      null");
    }
    io::Printer::Print<>(printer,"));\n");
    pcVar18 = "};\n\n\n";
    io::Printer::Print<>(printer,"};\n\n\n");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value_type._M_dataplus._M_p != &value_type.field_2) {
      operator_delete(value_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_type._M_dataplus._M_p != &key_type.field_2) {
LAB_0024a86e:
      operator_delete(key_type._M_dataplus._M_p);
    }
  }
  else {
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      key_type._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      value_type._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&key_type,
                 (FieldDescriptor **)&value_type);
    }
    BVar20 = 0x3e5b40;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) == 10) {
      (anonymous_namespace)::FieldDefinition_abi_cxx11_
                (&key_type,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)FieldDescriptor::kTypeToCppTypeMap);
      (anonymous_namespace)::FieldComments_abi_cxx11_
                (&value_type,(_anonymous_namespace_ *)field,(FieldDescriptor *)0x0,BVar20);
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                ((string *)local_100,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)0x0,false,false,false,BYTES_DEFAULT,
                 value_type._M_dataplus._M_p._0_1_);
      BVar20 = 0x3dc224;
      pbVar10 = &key_type;
      io::Printer::
      Print<char[9],std::__cxx11::string,char[8],std::__cxx11::string,char[5],std::__cxx11::string>
                (printer,"/**\n * $fielddef$\n$comment$ * @return {$type$}\n */\n",
                 (char (*) [9])"fielddef",pbVar10,(char (*) [8])0x3dc224,&value_type,
                 (char (*) [5])0x3eb793,(string *)local_100);
      if ((Printer *)local_100._0_8_ != (Printer *)(local_100 + 0x10)) {
        operator_delete((void *)local_100._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value_type._M_dataplus._M_p != &value_type.field_2) {
        operator_delete(value_type._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)key_type._M_dataplus._M_p != &key_type.field_2) {
        operator_delete(key_type._M_dataplus._M_p);
      }
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&key_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
                 (Descriptor *)pbVar10);
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                ((string *)local_100,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x0,BVar20,(bool)uVar22);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)local_100,0,(char *)0x0,0x3d9918);
      psVar11 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar11) {
        value_type.field_2._M_allocated_capacity = *psVar11;
        value_type.field_2._8_8_ = plVar7[3];
        value_type._M_dataplus._M_p = (pointer)&value_type.field_2;
      }
      else {
        value_type.field_2._M_allocated_capacity = *psVar11;
        value_type._M_dataplus._M_p = (pointer)*plVar7;
      }
      value_type._M_string_length = plVar7[1];
      *plVar7 = (long)psVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                ((string *)local_b8,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)0x0,false,false,false,BYTES_DEFAULT,
                 value_type._M_dataplus._M_p._0_1_);
      pFVar13 = (FieldDescriptor *)0x3dc146;
      local_50._M_dataplus._M_p = "";
      if (*(int *)(field + 0x3c) == 3) {
        local_50._M_dataplus._M_p = "Repeated";
      }
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                ((string *)&local_98,(_anonymous_namespace_ *)field,field_00);
      (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
                ((string *)(auStack_80 + 8),(_anonymous_namespace_ *)options,
                 (GeneratorOptions *)field,pFVar13);
      local_58 = (undefined1  [8])0x39cdf2;
      if (*(int *)(field + 0x3c) != 2) {
        local_58 = (undefined1  [8])0x393545;
      }
      io::Printer::
      Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[5],std::__cxx11::string,char[4],char_const*,char[6],std::__cxx11::string,char[13],std::__cxx11::string,char[9],char_const*>
                (printer,
                 "$class$.prototype.$gettername$ = function() {\n  return /** @type{$type$} */ (\n    jspb.Message.get$rpt$WrapperField(this, $wrapperclass$, $index$$required$));\n};\n\n\n"
                 ,(char (*) [6])0x3a2f2d,&key_type,(char (*) [11])"gettername",&value_type,
                 (char (*) [5])0x3eb793,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                 (char (*) [4])"rpt",(char **)(local_58 + 8),(char (*) [6])0x3a8ffa,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                 (char (*) [13])"wrapperclass",(string *)(auStack_80 + 8),(char (*) [9])"required",
                 (char **)local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((_Base_ptr *)local_98._M_allocated_capacity != &local_88) {
        operator_delete((void *)local_98._M_allocated_capacity);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._0_8_ != &local_a8) {
        operator_delete((void *)local_b8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value_type._M_dataplus._M_p != &value_type.field_2) {
        operator_delete(value_type._M_dataplus._M_p);
      }
      if ((Printer *)local_100._0_8_ != (Printer *)(local_100 + 0x10)) {
        operator_delete((void *)local_100._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)key_type._M_dataplus._M_p != &key_type.field_2) {
        operator_delete(key_type._M_dataplus._M_p);
      }
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,"gettername","gettername",field);
      pDVar4 = (Descriptor *)0x1;
      BVar20 = BYTES_DEFAULT;
      uVar22 = 0;
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                (&key_type,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)0x1,false,false,false,BYTES_DEFAULT,
                 value_type._M_dataplus._M_p._0_1_);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&value_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
                 pDVar4);
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                ((string *)local_b8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x0,BVar20,(bool)uVar22);
      pPVar12 = (Printer *)(local_100 + 0x10);
      puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0x3d6f09);
      pPVar14 = (Printer *)(puVar8 + 2);
      if ((Printer *)*puVar8 == pPVar14) {
        local_100._16_8_ = *(undefined8 *)pPVar14;
        local_100._24_8_ = puVar8[3];
        local_100._0_8_ = pPVar12;
      }
      else {
        local_100._16_8_ = *(undefined8 *)pPVar14;
        local_100._0_8_ = (Printer *)*puVar8;
      }
      local_100._8_8_ = puVar8[1];
      *puVar8 = pPVar14;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      local_98._M_allocated_capacity = (size_type)"Oneof";
      if (*(long *)(field + 0x58) == 0) {
        local_98._M_allocated_capacity = (size_type)"";
      }
      local_78._M_dataplus._M_p = "Repeated";
      if (*(int *)(field + 0x3c) != 3) {
        local_78._M_dataplus._M_p = "";
      }
      io::Printer::
      Print<char[13],std::__cxx11::string,char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[9],char_const*,char[12],char_const*>
                (printer,
                 "/**\n * @param {$optionaltype$} value\n * @return {!$class$} returns this\n*/\n$class$.prototype.$settername$ = function(value) {\n  return jspb.Message.set$oneoftag$$repeatedtag$WrapperField("
                 ,(char (*) [13])"optionaltype",&key_type,(char (*) [6])0x3a2f2d,&value_type,
                 (char (*) [11])"settername",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 (char (*) [9])"oneoftag",(char **)&local_98._M_allocated_capacity,
                 (char (*) [12])"repeatedtag",(char **)(auStack_80 + 8));
      paVar6 = &value_type.field_2;
      if ((Printer *)local_100._0_8_ != pPVar12) {
        operator_delete((void *)local_100._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._0_8_ != &local_a8) {
        operator_delete((void *)local_b8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value_type._M_dataplus._M_p != paVar6) {
        operator_delete(value_type._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)key_type._M_dataplus._M_p != &key_type.field_2) {
        operator_delete(key_type._M_dataplus._M_p);
      }
      pFVar13 = field;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,"settername","settername",field);
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                (&key_type,(_anonymous_namespace_ *)field,field_01);
      lVar1 = *(long *)(field + 0x58);
      if (lVar1 == 0) {
        value_type._M_dataplus._M_p = (pointer)paVar6;
        std::__cxx11::string::_M_construct<char_const*>((string *)&value_type,"");
      }
      else {
        (anonymous_namespace)::JSOneofArray_abi_cxx11_
                  ((string *)local_100,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                   pFVar13);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)local_100,0,(char *)0x0,0x3b35ec);
        psVar11 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar11) {
          value_type.field_2._M_allocated_capacity = *psVar11;
          value_type.field_2._8_8_ = plVar7[3];
          value_type._M_dataplus._M_p = (pointer)paVar6;
        }
        else {
          value_type.field_2._M_allocated_capacity = *psVar11;
          value_type._M_dataplus._M_p = (pointer)*plVar7;
        }
        value_type._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
      }
      pcVar18 = "this, $index$$oneofgroup$, value);\n};\n\n\n";
      BVar20 = 0x39d3b1;
      args_1 = (undefined1 *)&key_type;
      io::Printer::Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,"this, $index$$oneofgroup$, value);\n};\n\n\n",(char (*) [6])0x3a8ffa,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args_1,
                 (char (*) [11])0x39d3b1,&value_type);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value_type._M_dataplus._M_p != paVar6) {
        operator_delete(value_type._M_dataplus._M_p);
      }
      if ((lVar1 != 0) && ((Printer *)local_100._0_8_ != pPVar12)) {
        operator_delete((void *)local_100._0_8_);
      }
      _Var19._M_p = key_type._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)key_type._M_dataplus._M_p != &key_type.field_2) {
        operator_delete(key_type._M_dataplus._M_p);
      }
      if (*(int *)(field + 0x3c) == 3) {
        args_1 = field;
        pcVar18 = (char *)options;
        GenerateRepeatedMessageHelperMethods((Generator *)_Var19._M_p,options,printer,field);
      }
      goto LAB_0024a873;
    }
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      key_type._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      value_type._M_dataplus._M_p = (pointer)field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&key_type,
                 (FieldDescriptor **)&value_type);
    }
    uVar2 = options->binary ^ 1;
    if (*(int *)(field + 0x38) != 0xc) {
      uVar2 = 0;
    }
    pFVar13 = (FieldDescriptor *)0x0;
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)0x0,false,false,SUB41(uVar2,0),BYTES_DEFAULT,
               value_type._M_dataplus._M_p._0_1_);
    (anonymous_namespace)::FieldDefinition_abi_cxx11_
              (&value_type,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,pFVar13);
    (anonymous_namespace)::FieldComments_abi_cxx11_
              ((string *)local_100,(_anonymous_namespace_ *)field,(FieldDescriptor *)(ulong)uVar2,
               (BytesMode)pFVar13);
    BVar20 = 0x3dc224;
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
    io::Printer::
    Print<char[9],std::__cxx11::string,char[8],std::__cxx11::string,char[5],std::__cxx11::string>
              (printer,"/**\n * $fielddef$\n$comment$ * @return {$type$}\n */\n",
               (char (*) [9])"fielddef",&value_type,(char (*) [8])0x3dc224,pbVar10,
               (char (*) [5])0x3eb793,&key_type);
    uVar21 = SUB81(pbVar10,0);
    if ((Printer *)local_100._0_8_ != (Printer *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value_type._M_dataplus._M_p != &value_type.field_2) {
      operator_delete(value_type._M_dataplus._M_p);
    }
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&value_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
               (Descriptor *)descriptor);
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)local_b8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar20,(bool)uVar21);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0x3d9918);
    local_100._0_8_ = local_100 + 0x10;
    pPVar12 = (Printer *)(plVar7 + 2);
    if ((Printer *)*plVar7 == pPVar12) {
      local_100._16_8_ = *(undefined8 *)pPVar12;
      local_100._24_8_ = plVar7[3];
    }
    else {
      local_100._16_8_ = *(undefined8 *)pPVar12;
      local_100._0_8_ = (Printer *)*plVar7;
    }
    local_100._8_8_ = plVar7[1];
    *plVar7 = (long)pPVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    io::Printer::Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,"$class$.prototype.$gettername$ = function() {\n",(char (*) [6])0x3a2f2d,
               &value_type,(char (*) [11])"gettername",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    if ((Printer *)local_100._0_8_ != (Printer *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._0_8_ != &local_a8) {
      operator_delete((void *)local_b8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value_type._M_dataplus._M_p != &value_type.field_2) {
      operator_delete(value_type._M_dataplus._M_p);
    }
    io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (printer,"gettername","gettername",field);
    pcVar18 = "  return /** @type {$type$} */ (";
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,"  return /** @type {$type$} */ (",(char (*) [5])0x3eb793,&key_type);
    this_00 = field;
    bVar3 = anon_unknown_0::ReturnsNullWhenUnset
                      ((GeneratorOptions *)field,(FieldDescriptor *)pcVar18);
    pFVar13 = field;
    GenerateFieldValueExpression
              ((Generator *)this_00,printer,"this",field,*(int *)(field + 0x3c) != 3 && !bVar3);
    io::Printer::Print<>(printer,");\n};\n\n\n");
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      value_type._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
      local_100._0_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&value_type,
                 (FieldDescriptor **)local_100);
    }
    if (*(int *)(field + 0x38) == 0xc) {
      GenerateBytesWrapper(options,printer,field,BYTES_B64);
      pFVar13 = (FieldDescriptor *)0x2;
      GenerateBytesWrapper(options,printer,field,BYTES_U8);
    }
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&value_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
               (Descriptor *)pFVar13);
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              ((string *)local_100,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)0x1,false,false,false,BYTES_DEFAULT,
               value_type._M_dataplus._M_p._0_1_);
    pcVar18 = "/**\n * @param {$optionaltype$} value\n * @return {!$class$} returns this\n */\n";
    BVar20 = 0x39ceb2;
    pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
    io::Printer::Print<char[6],std::__cxx11::string,char[13],std::__cxx11::string>
              (printer,
               "/**\n * @param {$optionaltype$} value\n * @return {!$class$} returns this\n */\n",
               (char (*) [6])0x3a2f2d,&value_type,(char (*) [13])"optionaltype",pbVar10);
    uVar21 = SUB81(pbVar10,0);
    if ((Printer *)local_100._0_8_ != (Printer *)(local_100 + 0x10)) {
      operator_delete((void *)local_100._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value_type._M_dataplus._M_p != &value_type.field_2) {
      operator_delete(value_type._M_dataplus._M_p);
    }
    if ((*(int *)(*(long *)(field + 0x28) + 0x3c) == 3) && (*(int *)(field + 0x3c) != 3)) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        value_type._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        local_100._0_8_ = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)&value_type,
                   (FieldDescriptor **)local_100);
        pcVar18 = (char *)psVar17;
      }
      if (((*(int *)(field + 0x38) == 0xb) &&
          (bVar3 = FieldDescriptor::is_map_message_type(field), bVar3)) ||
         (bVar3 = anon_unknown_0::HasFieldPresence
                            ((GeneratorOptions *)field,(FieldDescriptor *)pcVar18), bVar3))
      goto LAB_0024a0ae;
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&value_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
                 (Descriptor *)descriptor_00);
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                ((string *)local_b8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x0,BVar20,(bool)uVar21);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     "set",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b8);
      (anonymous_namespace)::JSTypeTag_abi_cxx11_
                ((string *)&local_98,(_anonymous_namespace_ *)field,desc);
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                ((string *)(auStack_80 + 8),(_anonymous_namespace_ *)field,field_03);
      BVar20 = 0x39cebf;
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
      io::Printer::
      Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[8],std::__cxx11::string,char[6],std::__cxx11::string>
                (printer,
                 "$class$.prototype.$settername$ = function(value) {\n  return jspb.Message.setProto3$typetag$Field(this, $index$, value);\n};\n\n\n"
                 ,(char (*) [6])0x3a2f2d,&value_type,(char (*) [11])"settername",pbVar10,
                 (char (*) [8])"typetag",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                 (char (*) [6])0x3a8ffa,(string *)(auStack_80 + 8));
      uVar21 = SUB81(pbVar10,0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      if ((_Base_ptr *)local_98._M_allocated_capacity != &local_88) {
        operator_delete((void *)local_98._M_allocated_capacity);
      }
      if ((Printer *)local_100._0_8_ != (Printer *)(local_100 + 0x10)) {
        operator_delete((void *)local_100._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._0_8_ != &local_a8) {
        operator_delete((void *)local_b8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value_type._M_dataplus._M_p != &value_type.field_2) {
        operator_delete(value_type._M_dataplus._M_p);
      }
      pcVar18 = "settername";
      args_1 = field;
      _Var19._M_p = &printer->variable_delimiter_;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,"settername","settername",field);
    }
    else {
LAB_0024a0ae:
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&value_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
                 (Descriptor *)descriptor_00);
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                ((string *)local_b8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x0,BVar20,(bool)uVar21);
      puVar8 = (undefined8 *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0x3d6f09);
      local_100._0_8_ = local_100 + 0x10;
      pPVar12 = (Printer *)(puVar8 + 2);
      if ((Printer *)*puVar8 == pPVar12) {
        local_100._16_8_ = *(undefined8 *)pPVar12;
        local_100._24_8_ = puVar8[3];
      }
      else {
        local_100._16_8_ = *(undefined8 *)pPVar12;
        local_100._0_8_ = (Printer *)*puVar8;
      }
      local_100._8_8_ = puVar8[1];
      *puVar8 = pPVar12;
      puVar8[1] = 0;
      *(undefined1 *)(puVar8 + 2) = 0;
      pcVar16 = "";
      local_78._M_dataplus._M_p = "Oneof";
      if (*(long *)(field + 0x58) == 0) {
        local_78._M_dataplus._M_p = "";
      }
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                ((string *)&local_98,(_anonymous_namespace_ *)field,
                 (FieldDescriptor *)local_100._8_8_);
      io::Printer::
      Print<char[6],std::__cxx11::string,char[11],std::__cxx11::string,char[9],char_const*,char[6],std::__cxx11::string>
                (printer,
                 "$class$.prototype.$settername$ = function(value) {\n  return jspb.Message.set$oneoftag$Field(this, $index$"
                 ,(char (*) [6])0x3a2f2d,&value_type,(char (*) [11])"settername",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                 (char (*) [9])"oneoftag",(char **)(auStack_80 + 8),(char (*) [6])0x3a8ffa,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
      if ((_Base_ptr *)local_98._M_allocated_capacity != &local_88) {
        operator_delete((void *)local_98._M_allocated_capacity);
      }
      if ((Printer *)local_100._0_8_ != (Printer *)(local_100 + 0x10)) {
        operator_delete((void *)local_100._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._0_8_ != &local_a8) {
        operator_delete((void *)local_b8._0_8_);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value_type._M_dataplus._M_p != &value_type.field_2) {
        operator_delete(value_type._M_dataplus._M_p);
      }
      pFVar13 = field;
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (printer,"settername","settername",field);
      local_b8._0_8_ = "";
      local_98._M_allocated_capacity = (long)" \t" + 2;
      lVar1 = *(long *)(field + 0x58);
      if (lVar1 == 0) {
        value_type._M_dataplus._M_p = (pointer)&value_type.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&value_type,"");
      }
      else {
        (anonymous_namespace)::JSOneofArray_abi_cxx11_
                  ((string *)local_100,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                   pFVar13);
        plVar7 = (long *)std::__cxx11::string::replace((ulong)local_100,0,(char *)0x0,0x3b35ec);
        value_type._M_dataplus._M_p = (pointer)&value_type.field_2;
        psVar11 = (size_type *)(plVar7 + 2);
        if ((size_type *)*plVar7 == psVar11) {
          value_type.field_2._M_allocated_capacity = *psVar11;
          value_type.field_2._8_8_ = plVar7[3];
        }
        else {
          value_type.field_2._M_allocated_capacity = *psVar11;
          value_type._M_dataplus._M_p = (pointer)*plVar7;
        }
        value_type._M_string_length = plVar7[1];
        *plVar7 = (long)psVar11;
        plVar7[1] = 0;
        *(undefined1 *)(plVar7 + 2) = 0;
      }
      if (*(int *)(field + 0x3c) == 3) {
        pcVar16 = " || []";
      }
      pcVar18 = "$oneofgroup$, $type$value$rptvalueinit$$typeclose$);\n};\n\n\n";
      BVar20 = 0x39d0d6;
      args_1 = local_b8;
      paVar6 = &local_98;
      local_78._M_dataplus._M_p = pcVar16;
      io::Printer::
      Print<char[5],char_const*,char[10],char_const*,char[11],std::__cxx11::string,char[13],char_const*>
                (printer,"$oneofgroup$, $type$value$rptvalueinit$$typeclose$);\n};\n\n\n",
                 (char (*) [5])0x3eb793,(char **)args_1,(char (*) [10])"typeclose",
                 (char **)&paVar6->_M_allocated_capacity,(char (*) [11])0x39d3b1,&value_type,
                 (char (*) [13])"rptvalueinit",(char **)(auStack_80 + 8));
      uVar21 = SUB81(paVar6,0);
      _Var19 = value_type._M_dataplus;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)value_type._M_dataplus._M_p != &value_type.field_2) {
        operator_delete(value_type._M_dataplus._M_p);
      }
      if ((lVar1 != 0) &&
         (_Var19._M_p = (pointer)local_100._0_8_,
         (Printer *)local_100._0_8_ != (Printer *)(local_100 + 0x10))) {
        operator_delete((void *)local_100._0_8_);
      }
    }
    if (*(int *)(field + 0x3c) == 3) {
      BVar20 = BYTES_DEFAULT;
      args_1 = field;
      pcVar18 = (char *)options;
      GenerateRepeatedPrimitiveHelperMethods((Generator *)_Var19._M_p,options,printer,field,false);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_type._M_dataplus._M_p != &key_type.field_2) goto LAB_0024a86e;
  }
LAB_0024a873:
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    pcVar18 = (char *)&key_type;
    key_type._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
    value_type._M_dataplus._M_p = (pointer)field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)pcVar18,
               (FieldDescriptor **)&value_type);
  }
  if ((*(int *)(field + 0x38) == 0xb) &&
     (bVar3 = FieldDescriptor::is_map_message_type(field), bVar3)) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
               (Descriptor *)args_1);
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)local_b8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar20,(bool)uVar21);
    BVar20 = 5;
    plVar7 = (long *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0x39d1c6);
    psVar11 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar11) {
      value_type.field_2._M_allocated_capacity = *psVar11;
      value_type.field_2._8_8_ = plVar7[3];
      value_type._M_dataplus._M_p = (pointer)&value_type.field_2;
    }
    else {
      value_type.field_2._M_allocated_capacity = *psVar11;
      value_type._M_dataplus._M_p = (pointer)*plVar7;
    }
    value_type._M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)(auStack_80 + 8),(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar20,(bool)uVar21);
    puVar8 = (undefined8 *)
             std::__cxx11::string::replace((ulong)(auStack_80 + 8),0,(char *)0x0,0x3d9918);
    pp_Var15 = (_Base_ptr *)(puVar8 + 2);
    if ((_Base_ptr *)*puVar8 == pp_Var15) {
      local_88 = *pp_Var15;
      auStack_80 = (undefined1  [8])puVar8[3];
      local_98._M_allocated_capacity = (size_type)&local_88;
    }
    else {
      local_88 = *pp_Var15;
      local_98._M_allocated_capacity = (size_type)(_Base_ptr *)*puVar8;
    }
    local_98._8_8_ = puVar8[1];
    *puVar8 = pp_Var15;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    BVar20 = 0x39d1ba;
    uVar21 = (char)&value_type;
    io::Printer::
    Print<char[6],std::__cxx11::string,char[12],std::__cxx11::string,char[11],std::__cxx11::string>
              (printer,
               "/**\n * Clears values from the map. The map will be non-null.\n * @return {!$class$} returns this\n */\n$class$.prototype.$clearername$ = function() {\n  this.$gettername$().clear();\n  return this;};\n\n\n"
               ,(char (*) [6])0x3a2f2d,&key_type,(char (*) [12])"clearername",&value_type,
               (char (*) [11])"gettername",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
    if ((_Base_ptr *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value_type._M_dataplus._M_p != &value_type.field_2) {
      operator_delete(value_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._0_8_ != &local_a8) {
      operator_delete((void *)local_b8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_type._M_dataplus._M_p != &key_type.field_2) {
      operator_delete(key_type._M_dataplus._M_p);
    }
  }
  else {
    if (*(int *)(field + 0x3c) != 3) {
      if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
        pcVar18 = (char *)&key_type;
        key_type._M_dataplus._M_p = (pointer)FieldDescriptor::TypeOnceInit;
        value_type._M_dataplus._M_p = (pointer)field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x30),(_func_void_FieldDescriptor_ptr **)pcVar18,
                   (FieldDescriptor **)&value_type);
      }
      args_1 = FieldDescriptor::kTypeToCppTypeMap;
      if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 10)
         || (*(int *)(field + 0x3c) == 2)) {
        bVar3 = anon_unknown_0::HasFieldPresence
                          ((GeneratorOptions *)field,(FieldDescriptor *)pcVar18);
        if (bVar3) {
          (anonymous_namespace)::GetMessagePath_abi_cxx11_
                    (&key_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50)
                     ,(Descriptor *)args_1);
          (anonymous_namespace)::JSGetterName_abi_cxx11_
                    ((string *)local_b8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                     (FieldDescriptor *)0x0,BVar20,(bool)uVar21);
          plVar7 = (long *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0x39d1c6);
          value_type._M_dataplus._M_p = (pointer)&value_type.field_2;
          psVar11 = (size_type *)(plVar7 + 2);
          if ((size_type *)*plVar7 == psVar11) {
            value_type.field_2._M_allocated_capacity = *psVar11;
            value_type.field_2._8_8_ = plVar7[3];
          }
          else {
            value_type.field_2._M_allocated_capacity = *psVar11;
            value_type._M_dataplus._M_p = (pointer)*plVar7;
          }
          value_type._M_string_length = plVar7[1];
          *plVar7 = (long)psVar11;
          plVar7[1] = 0;
          *(undefined1 *)(plVar7 + 2) = 0;
          lVar1 = *(long *)(field + 0x58);
          local_58 = (undefined1  [8])0x39ced3;
          if (lVar1 == 0) {
            local_58 = (undefined1  [8])0x393545;
            local_98._M_allocated_capacity = (size_type)&local_88;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"");
            pFVar13 = extraout_RDX;
          }
          else {
            (anonymous_namespace)::JSOneofArray_abi_cxx11_
                      ((string *)(auStack_80 + 8),(_anonymous_namespace_ *)options,
                       (GeneratorOptions *)field,(FieldDescriptor *)"Oneof");
            puVar8 = (undefined8 *)
                     std::__cxx11::string::replace((ulong)(auStack_80 + 8),0,(char *)0x0,0x3b35ec);
            local_98._M_allocated_capacity = (size_type)&local_88;
            pp_Var15 = (_Base_ptr *)(puVar8 + 2);
            if ((_Base_ptr *)*puVar8 == pp_Var15) {
              local_88 = *pp_Var15;
              auStack_80 = (undefined1  [8])puVar8[3];
            }
            else {
              local_88 = *pp_Var15;
              local_98._M_allocated_capacity = (size_type)(_Base_ptr *)*puVar8;
            }
            pFVar13 = (FieldDescriptor *)puVar8[1];
            *puVar8 = pp_Var15;
            puVar8[1] = 0;
            *(undefined1 *)(puVar8 + 2) = 0;
            local_98._8_8_ = pFVar13;
          }
          (anonymous_namespace)::JSFieldIndex_abi_cxx11_
                    ((string *)(local_58 + 8),(_anonymous_namespace_ *)field,pFVar13);
          BVar20 = 0x39d1ba;
          uVar21 = (char)&value_type;
          io::Printer::
          Print<char[6],std::__cxx11::string,char[12],std::__cxx11::string,char[11],char_const*,char[16],std::__cxx11::string,char[6],std::__cxx11::string>
                    (printer,
                     "/**\n * Clears the field making it undefined.\n * @return {!$class$} returns this\n */\n$class$.prototype.$clearername$ = function() {\n  return jspb.Message.set$maybeoneof$Field(this, $index$$maybeoneofgroup$, "
                     ,(char (*) [6])0x3a2f2d,&key_type,(char (*) [12])"clearername",&value_type,
                     (char (*) [11])"maybeoneof",(char **)local_58,(char (*) [16])"maybeoneofgroup",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
                     (char (*) [6])0x3a8ffa,(string *)(local_58 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_50._M_dataplus._M_p != &local_50.field_2) {
            operator_delete(local_50._M_dataplus._M_p);
          }
          if ((_Base_ptr *)local_98._M_allocated_capacity != &local_88) {
            operator_delete((void *)local_98._M_allocated_capacity);
          }
          if ((lVar1 != 0) &&
             ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2)) {
            operator_delete(local_78._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)value_type._M_dataplus._M_p != &value_type.field_2) {
            operator_delete(value_type._M_dataplus._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._0_8_ != &local_a8) {
            operator_delete((void *)local_b8._0_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)key_type._M_dataplus._M_p != &key_type.field_2) {
            operator_delete(key_type._M_dataplus._M_p);
          }
          io::Printer::Annotate<google::protobuf::FieldDescriptor>
                    (printer,"clearername","clearername",field);
          key_type._M_dataplus._M_p = "undefined";
          if (*(int *)(field + 0x3c) == 3) {
            key_type._M_dataplus._M_p = "[]";
          }
          args_1 = (undefined1 *)&key_type;
          pcVar18 = "$clearedvalue$);\n};\n\n\n";
          io::Printer::Print<char[13],char_const*>
                    (printer,"$clearedvalue$);\n};\n\n\n",(char (*) [13])"clearedvalue",
                     (char **)args_1);
        }
        goto LAB_0024ad29;
      }
    }
    pcVar18 = "Clears the message field making it undefined.";
    if (*(int *)(field + 0x3c) == 3) {
      pcVar18 = "Clears the list making it empty but non-null.";
    }
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
               (Descriptor *)args_1);
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)local_b8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar20,(bool)uVar21);
    BVar20 = 5;
    plVar7 = (long *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0x39d1c6);
    value_type._M_dataplus._M_p = (pointer)&value_type.field_2;
    psVar11 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar11) {
      value_type.field_2._M_allocated_capacity = *psVar11;
      value_type.field_2._8_8_ = plVar7[3];
    }
    else {
      value_type.field_2._M_allocated_capacity = *psVar11;
      value_type._M_dataplus._M_p = (pointer)*plVar7;
    }
    value_type._M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)(auStack_80 + 8),(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar20,(bool)uVar21);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)(auStack_80 + 8),0,(char *)0x0,0x3d6f09);
    pp_Var15 = (_Base_ptr *)(plVar7 + 2);
    if ((_Base_ptr *)*plVar7 == pp_Var15) {
      local_88 = *pp_Var15;
      auStack_80 = (undefined1  [8])plVar7[3];
      local_98._M_allocated_capacity = (size_type)&local_88;
    }
    else {
      local_88 = *pp_Var15;
      local_98._M_allocated_capacity = (size_type)(_Base_ptr *)*plVar7;
    }
    local_98._8_8_ = plVar7[1];
    *plVar7 = (long)pp_Var15;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    local_50._M_dataplus._M_p = "undefined";
    if (*(int *)(field + 0x3c) == 3) {
      local_50._M_dataplus._M_p = "[]";
    }
    BVar20 = 0x3a2f2d;
    pbVar10 = &key_type;
    io::Printer::
    Print<char[6],char[46],char[6],std::__cxx11::string,char[12],std::__cxx11::string,char[11],std::__cxx11::string,char[13],char_const*>
              (printer,
               "/**\n * $jsdoc$\n * @return {!$class$} returns this\n */\n$class$.prototype.$clearername$ = function() {\n  return this.$settername$($clearedvalue$);\n};\n\n\n"
               ,(char (*) [6])"jsdoc",(char (*) [46])pcVar18,(char (*) [6])0x3a2f2d,pbVar10,
               (char (*) [12])"clearername",&value_type,(char (*) [11])"settername",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98,
               (char (*) [13])"clearedvalue",(char **)(local_58 + 8));
    uVar21 = SUB81(pbVar10,0);
    if ((_Base_ptr *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value_type._M_dataplus._M_p != &value_type.field_2) {
      operator_delete(value_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._0_8_ != &local_a8) {
      operator_delete((void *)local_b8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_type._M_dataplus._M_p != &key_type.field_2) {
      operator_delete(key_type._M_dataplus._M_p);
    }
  }
  pcVar18 = "clearername";
  args_1 = field;
  io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (printer,"clearername","clearername",field);
LAB_0024ad29:
  bVar3 = anon_unknown_0::HasFieldPresence((GeneratorOptions *)field,(FieldDescriptor *)pcVar18);
  if (bVar3) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&key_type,(_anonymous_namespace_ *)options,*(GeneratorOptions **)(field + 0x50),
               (Descriptor *)args_1);
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)local_b8,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,BVar20,(bool)uVar21);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)local_b8,0,(char *)0x0,0x39d473);
    psVar11 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar11) {
      value_type.field_2._M_allocated_capacity = *psVar11;
      value_type.field_2._8_8_ = plVar7[3];
      value_type._M_dataplus._M_p = (pointer)&value_type.field_2;
    }
    else {
      value_type.field_2._M_allocated_capacity = *psVar11;
      value_type._M_dataplus._M_p = (pointer)*plVar7;
    }
    value_type._M_string_length = plVar7[1];
    *plVar7 = (long)psVar11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              ((string *)&local_98,(_anonymous_namespace_ *)field,
               (FieldDescriptor *)value_type._M_string_length);
    io::Printer::
    Print<char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[6],std::__cxx11::string>
              (printer,
               "/**\n * Returns whether this field is set.\n * @return {boolean}\n */\n$class$.prototype.$hasername$ = function() {\n  return jspb.Message.getField(this, $index$) != null;\n};\n\n\n"
               ,(char (*) [6])0x3a2f2d,&key_type,(char (*) [10])"hasername",&value_type,
               (char (*) [6])0x3a8ffa,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_98);
    if ((_Base_ptr *)local_98._M_allocated_capacity != &local_88) {
      operator_delete((void *)local_98._M_allocated_capacity);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)value_type._M_dataplus._M_p != &value_type.field_2) {
      operator_delete(value_type._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._0_8_ != &local_a8) {
      operator_delete((void *)local_b8._0_8_);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)key_type._M_dataplus._M_p != &key_type.field_2) {
      operator_delete(key_type._M_dataplus._M_p);
    }
    io::Printer::Annotate<google::protobuf::FieldDescriptor>(printer,"hasername","hasername",field);
  }
  return;
}

Assistant:

void Generator::GenerateClassField(const GeneratorOptions& options,
                                   io::Printer* printer,
                                   const FieldDescriptor* field) const {
  if (field->is_map()) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    // Map field: special handling to instantiate the map object on demand.
    std::string key_type =
        JSFieldTypeAnnotation(options, key_field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ true,
                              /* singular_if_not_packed = */ false);
    std::string value_type =
        JSFieldTypeAnnotation(options, value_field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ true,
                              /* singular_if_not_packed = */ false);

    printer->Print(
        "/**\n"
        " * $fielddef$\n"
        " * @param {boolean=} opt_noLazyCreate Do not create the map if\n"
        " * empty, instead returning `undefined`\n"
        " * @return {!jspb.Map<$keytype$,$valuetype$>}\n"
        " */\n",
        "fielddef", FieldDefinition(options, field), "keytype", key_type,
        "valuetype", value_type);
    printer->Print(
        "$class$.prototype.$gettername$ = function(opt_noLazyCreate) {\n"
        "  return /** @type {!jspb.Map<$keytype$,$valuetype$>} */ (\n",
        "class", GetMessagePath(options, field->containing_type()),
        "gettername", "get" + JSGetterName(options, field), "keytype", key_type,
        "valuetype", value_type);
    printer->Annotate("gettername", field);
    printer->Print(
        "      jspb.Message.getMapField(this, $index$, opt_noLazyCreate",
        "index", JSFieldIndex(field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(
          ",\n"
          "      $messageType$",
          "messageType", GetMessagePath(options, value_field->message_type()));
    } else {
      printer->Print(
          ",\n"
          "      null");
    }

    printer->Print("));\n");

    printer->Print(
        "};\n"
        "\n"
        "\n");
  } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    // Message field: special handling in order to wrap the underlying data
    // array with a message object.

    printer->Print(
        "/**\n"
        " * $fielddef$\n"
        "$comment$"
        " * @return {$type$}\n"
        " */\n",
        "fielddef", FieldDefinition(options, field), "comment",
        FieldComments(field, BYTES_DEFAULT), "type",
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false));
    printer->Print(
        "$class$.prototype.$gettername$ = function() {\n"
        "  return /** @type{$type$} */ (\n"
        "    jspb.Message.get$rpt$WrapperField(this, $wrapperclass$, "
        "$index$$required$));\n"
        "};\n"
        "\n"
        "\n",
        "class", GetMessagePath(options, field->containing_type()),
        "gettername", "get" + JSGetterName(options, field), "type",
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false),
        "rpt", (field->is_repeated() ? "Repeated" : ""), "index",
        JSFieldIndex(field), "wrapperclass", SubmessageTypeRef(options, field),
        "required",
        (field->label() == FieldDescriptor::LABEL_REQUIRED ? ", 1" : ""));
    printer->Annotate("gettername", field);
    printer->Print(
        "/**\n"
        " * @param {$optionaltype$} value\n"
        " * @return {!$class$} returns this\n"
        "*/\n"
        "$class$.prototype.$settername$ = function(value) {\n"
        "  return jspb.Message.set$oneoftag$$repeatedtag$WrapperField(",
        "optionaltype",
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ true,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false),
        "class", GetMessagePath(options, field->containing_type()),
        "settername", "set" + JSGetterName(options, field), "oneoftag",
        (field->containing_oneof() ? "Oneof" : ""), "repeatedtag",
        (field->is_repeated() ? "Repeated" : ""));
    printer->Annotate("settername", field);

    printer->Print(
        "this, $index$$oneofgroup$, value);\n"
        "};\n"
        "\n"
        "\n",
        "index", JSFieldIndex(field), "oneofgroup",
        (field->containing_oneof() ? (", " + JSOneofArray(options, field))
                                   : ""));

    if (field->is_repeated()) {
      GenerateRepeatedMessageHelperMethods(options, printer, field);
    }

  } else {
    bool untyped =
        false;

    // Simple (primitive) field, either singular or repeated.

    // TODO(b/26173701): Always use BYTES_DEFAULT for the getter return type;
    // at this point we "lie" to non-binary users and tell the return
    // type is always base64 string, pending a LSC to migrate to typed getters.
    BytesMode bytes_mode =
        field->type() == FieldDescriptor::TYPE_BYTES && !options.binary
            ? BYTES_B64
            : BYTES_DEFAULT;
    std::string typed_annotation =
        JSFieldTypeAnnotation(options, field,
                              /* is_setter_argument = */ false,
                              /* force_present = */ false,
                              /* singular_if_not_packed = */ false,
                              /* bytes_mode = */ bytes_mode);
    if (untyped) {
      printer->Print(
          "/**\n"
          " * @return {?} Raw field, untyped.\n"
          " */\n");
    } else {
      printer->Print(
          "/**\n"
          " * $fielddef$\n"
          "$comment$"
          " * @return {$type$}\n"
          " */\n",
          "fielddef", FieldDefinition(options, field), "comment",
          FieldComments(field, bytes_mode), "type", typed_annotation);
    }

    printer->Print("$class$.prototype.$gettername$ = function() {\n", "class",
                   GetMessagePath(options, field->containing_type()),
                   "gettername", "get" + JSGetterName(options, field));
    printer->Annotate("gettername", field);

    if (untyped) {
      printer->Print("  return ");
    } else {
      printer->Print("  return /** @type {$type$} */ (", "type",
                     typed_annotation);
    }

    bool use_default = !ReturnsNullWhenUnset(options, field);

    // Raw fields with no default set should just return undefined.
    if (untyped && !field->has_default_value()) {
      use_default = false;
    }

    // Repeated fields get initialized to their default in the constructor
    // (why?), so we emit a plain getField() call for them.
    if (field->is_repeated()) {
      use_default = false;
    }

    GenerateFieldValueExpression(printer, "this", field, use_default);

    if (untyped) {
      printer->Print(
          ";\n"
          "};\n"
          "\n"
          "\n");
    } else {
      printer->Print(
          ");\n"
          "};\n"
          "\n"
          "\n");
    }

    if (field->type() == FieldDescriptor::TYPE_BYTES && !untyped) {
      GenerateBytesWrapper(options, printer, field, BYTES_B64);
      GenerateBytesWrapper(options, printer, field, BYTES_U8);
    }

    printer->Print(
        "/**\n"
        " * @param {$optionaltype$} value\n"
        " * @return {!$class$} returns this\n"
        " */\n",
        "class", GetMessagePath(options, field->containing_type()),
        "optionaltype",
        untyped ? "*"
                : JSFieldTypeAnnotation(options, field,
                                        /* is_setter_argument = */ true,
                                        /* force_present = */ false,
                                        /* singular_if_not_packed = */ false));

    if (field->file()->syntax() == FileDescriptor::SYNTAX_PROTO3 &&
        !field->is_repeated() && !field->is_map() &&
        !HasFieldPresence(options, field)) {
      // Proto3 non-repeated and non-map fields without presence use the
      // setProto3*Field function.
      printer->Print(
          "$class$.prototype.$settername$ = function(value) {\n"
          "  return jspb.Message.setProto3$typetag$Field(this, $index$, "
          "value);"
          "\n"
          "};\n"
          "\n"
          "\n",
          "class", GetMessagePath(options, field->containing_type()),
          "settername", "set" + JSGetterName(options, field), "typetag",
          JSTypeTag(field), "index", JSFieldIndex(field));
      printer->Annotate("settername", field);
    } else {
      // Otherwise, use the regular setField function.
      printer->Print(
          "$class$.prototype.$settername$ = function(value) {\n"
          "  return jspb.Message.set$oneoftag$Field(this, $index$",
          "class", GetMessagePath(options, field->containing_type()),
          "settername", "set" + JSGetterName(options, field), "oneoftag",
          (field->containing_oneof() ? "Oneof" : ""), "index",
          JSFieldIndex(field));
      printer->Annotate("settername", field);
      printer->Print(
          "$oneofgroup$, $type$value$rptvalueinit$$typeclose$);\n"
          "};\n"
          "\n"
          "\n",
          "type",
          untyped ? "/** @type{string|number|boolean|Array|undefined} */(" : "",
          "typeclose", untyped ? ")" : "", "oneofgroup",
          (field->containing_oneof() ? (", " + JSOneofArray(options, field))
                                     : ""),
          "rptvalueinit", (field->is_repeated() ? " || []" : ""));
    }

    if (untyped) {
      printer->Print(
          "/**\n"
          " * Clears the value.\n"
          " * @return {!$class$} returns this\n"
          " */\n",
          "class", GetMessagePath(options, field->containing_type()));
    }

    if (field->is_repeated()) {
      GenerateRepeatedPrimitiveHelperMethods(options, printer, field, untyped);
    }
  }

  // Generate clearFoo() method for map fields, repeated fields, and other
  // fields with presence.
  if (field->is_map()) {
    // clang-format off
    printer->Print(
        "/**\n"
        " * Clears values from the map. The map will be non-null.\n"
        " * @return {!$class$} returns this\n"
        " */\n"
        "$class$.prototype.$clearername$ = function() {\n"
        "  this.$gettername$().clear();\n"
        "  return this;"
        "};\n"
        "\n"
        "\n",
        "class", GetMessagePath(options, field->containing_type()),
        "clearername", "clear" + JSGetterName(options, field),
        "gettername", "get" + JSGetterName(options, field));
    // clang-format on
    printer->Annotate("clearername", field);
  } else if (field->is_repeated() ||
             (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
              !field->is_required())) {
    // Fields where we can delegate to the regular setter.
    // clang-format off
    printer->Print(
        "/**\n"
        " * $jsdoc$\n"
        " * @return {!$class$} returns this\n"
        " */\n"
        "$class$.prototype.$clearername$ = function() {\n"
        "  return this.$settername$($clearedvalue$);\n"
        "};\n"
        "\n"
        "\n",
       "jsdoc", field->is_repeated()
           ? "Clears the list making it empty but non-null."
           : "Clears the message field making it undefined.",
        "class", GetMessagePath(options, field->containing_type()),
        "clearername", "clear" + JSGetterName(options, field),
        "settername", "set" + JSGetterName(options, field),
        "clearedvalue", (field->is_repeated() ? "[]" : "undefined"));
    // clang-format on
    printer->Annotate("clearername", field);
  } else if (HasFieldPresence(options, field)) {
    // Fields where we can't delegate to the regular setter because it doesn't
    // accept "undefined" as an argument.
    // clang-format off
    printer->Print(
        "/**\n"
        " * Clears the field making it undefined.\n"
        " * @return {!$class$} returns this\n"
        " */\n"
        "$class$.prototype.$clearername$ = function() {\n"
        "  return jspb.Message.set$maybeoneof$Field(this, "
            "$index$$maybeoneofgroup$, ",
        "class", GetMessagePath(options, field->containing_type()),
        "clearername", "clear" + JSGetterName(options, field),
        "maybeoneof", (field->containing_oneof() ? "Oneof" : ""),
        "maybeoneofgroup", (field->containing_oneof()
                            ? (", " + JSOneofArray(options, field))
                            : ""),
        "index", JSFieldIndex(field));
    // clang-format on
    printer->Annotate("clearername", field);
    printer->Print(
        "$clearedvalue$);\n"
        "};\n"
        "\n"
        "\n",
        "clearedvalue", (field->is_repeated() ? "[]" : "undefined"));
  }

  if (HasFieldPresence(options, field)) {
    printer->Print(
        "/**\n"
        " * Returns whether this field is set.\n"
        " * @return {boolean}\n"
        " */\n"
        "$class$.prototype.$hasername$ = function() {\n"
        "  return jspb.Message.getField(this, $index$) != null;\n"
        "};\n"
        "\n"
        "\n",
        "class", GetMessagePath(options, field->containing_type()), "hasername",
        "has" + JSGetterName(options, field), "index", JSFieldIndex(field));
    printer->Annotate("hasername", field);
  }
}